

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<long,_int,_10>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (long *lhs,int *rhs,long *result)

{
  long lVar1;
  long *in_RDX;
  int *in_RSI;
  long *in_RDI;
  int64_t tmp;
  
  lVar1 = *in_RDI + (long)*in_RSI;
  if (*in_RDI < 0) {
    if ((*in_RSI < 0) && (*in_RDI < lVar1)) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  else if ((-1 < *in_RSI) && (lVar1 < *in_RDI)) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
  }
  *in_RDX = lVar1;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is std::int64_t, rhs signed
        std::int64_t tmp = (std::int64_t)((std::uint64_t)lhs + (std::uint64_t)rhs);

        if( lhs >= 0 )
        {
            // mixed sign cannot overflow
            if( rhs >= 0 && tmp < lhs )
                E::SafeIntOnOverflow();
        }
        else
        {
            // lhs negative
            if( rhs < 0 && tmp > lhs )
                E::SafeIntOnOverflow();
        }

        result = (T)tmp;
    }